

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Cluster::Load(Cluster *this,longlong *pos,long *len)

{
  bool bVar1;
  int iVar2;
  longlong lVar3;
  longlong lVar4;
  _func_int **size_00;
  long local_c0;
  longlong unknown_size_1;
  longlong size_1;
  longlong id;
  longlong result_1;
  longlong cluster_stop;
  long lStack_80;
  bool bBlock;
  longlong new_pos;
  longlong timecode;
  longlong unknown_size;
  longlong size;
  longlong id_;
  longlong result;
  longlong cluster_size;
  long lStack_40;
  int status;
  longlong avail;
  longlong total;
  IMkvReader *pReader;
  long *len_local;
  longlong *pos_local;
  Cluster *this_local;
  
  if (this->m_pSegment == (Segment *)0x0) {
    this_local = (Cluster *)0xffffffffffffffff;
  }
  else if (this->m_timecode < 0) {
    if ((this->m_pos == this->m_element_start) && (this->m_element_size < 0)) {
      total = (longlong)this->m_pSegment->m_pReader;
      pReader = (IMkvReader *)len;
      len_local = pos;
      pos_local = (longlong *)this;
      iVar2 = (*((IMkvReader *)total)->_vptr_IMkvReader[1])(total,&avail,&stack0xffffffffffffffc0);
      if (iVar2 < 0) {
        this_local = (Cluster *)(long)iVar2;
      }
      else if ((avail < 0) || ((lStack_40 <= avail && (this->m_pos <= avail)))) {
        *len_local = this->m_pos;
        result = -1;
        if (lStack_40 < *len_local + 1) {
          pReader->_vptr_IMkvReader = (_func_int **)0x1;
          this_local = (Cluster *)0xfffffffffffffffd;
        }
        else {
          this_local = (Cluster *)GetUIntLength((IMkvReader *)total,*len_local,(long *)pReader);
          if (-1 < (long)this_local) {
            if ((long)this_local < 1) {
              if (lStack_40 < *len_local + (long)pReader->_vptr_IMkvReader) {
                this_local = (Cluster *)0xfffffffffffffffd;
              }
              else {
                this_local = (Cluster *)ReadID((IMkvReader *)total,*len_local,(long *)pReader);
                if (-1 < (long)this_local) {
                  if (this_local == (Cluster *)0x1f43b675) {
                    *len_local = (long)pReader->_vptr_IMkvReader + *len_local;
                    if (lStack_40 < *len_local + 1) {
                      pReader->_vptr_IMkvReader = (_func_int **)0x1;
                      this_local = (Cluster *)0xfffffffffffffffd;
                    }
                    else {
                      this_local = (Cluster *)
                                   GetUIntLength((IMkvReader *)total,*len_local,(long *)pReader);
                      if (-1 < (long)this_local) {
                        if ((long)this_local < 1) {
                          if (lStack_40 < *len_local + (long)pReader->_vptr_IMkvReader) {
                            this_local = (Cluster *)0xfffffffffffffffd;
                          }
                          else {
                            lVar3 = ReadUInt((IMkvReader *)total,*len_local,(long *)pReader);
                            if (lVar3 < 0) {
                              this_local = (Cluster *)0xffffffffffffffff;
                            }
                            else if (lVar3 == 0) {
                              this_local = (Cluster *)0xfffffffffffffffe;
                            }
                            else {
                              *len_local = (long)pReader->_vptr_IMkvReader + *len_local;
                              if (lVar3 != (1L << ((char)pReader->_vptr_IMkvReader * '\a' & 0x3fU))
                                           + -1) {
                                result = lVar3;
                              }
                              new_pos = -1;
                              lStack_80 = -1;
                              bVar1 = false;
                              if (result < 0) {
                                local_c0 = -1;
                              }
                              else {
                                local_c0 = *len_local + result;
                              }
                              do {
                                do {
                                  if ((-1 < local_c0) && (local_c0 <= *len_local)) {
LAB_00131504:
                                    if ((-1 < local_c0) && (local_c0 < *len_local)) {
                                      return -2;
                                    }
                                    if (new_pos < 0) {
                                      return -2;
                                    }
                                    if (!bVar1) {
                                      return -2;
                                    }
                                    this->m_pos = lStack_80;
                                    this->m_timecode = new_pos;
                                    if (-1 < result) {
                                      this->m_element_size = local_c0 - this->m_element_start;
                                    }
                                    return 0;
                                  }
                                  if (lStack_40 < *len_local + 1) {
                                    pReader->_vptr_IMkvReader = (_func_int **)0x1;
                                    return -3;
                                  }
                                  lVar3 = GetUIntLength((IMkvReader *)total,*len_local,
                                                        (long *)pReader);
                                  if (lVar3 < 0) {
                                    return lVar3;
                                  }
                                  if (0 < lVar3) {
                                    return -3;
                                  }
                                  if ((-1 < local_c0) &&
                                     (local_c0 < *len_local + (long)pReader->_vptr_IMkvReader)) {
                                    return -2;
                                  }
                                  if (lStack_40 < *len_local + (long)pReader->_vptr_IMkvReader) {
                                    return -3;
                                  }
                                  lVar3 = ReadID((IMkvReader *)total,*len_local,(long *)pReader);
                                  if (lVar3 < 0) {
                                    return lVar3;
                                  }
                                  if (lVar3 == 0) {
                                    return -2;
                                  }
                                  if ((lVar3 == 0x1f43b675) || (lVar3 == 0x1c53bb6b))
                                  goto LAB_00131504;
                                  *len_local = (long)pReader->_vptr_IMkvReader + *len_local;
                                  if (lStack_40 < *len_local + 1) {
                                    pReader->_vptr_IMkvReader = (_func_int **)0x1;
                                    return -3;
                                  }
                                  lVar4 = GetUIntLength((IMkvReader *)total,*len_local,
                                                        (long *)pReader);
                                  if (lVar4 < 0) {
                                    return lVar4;
                                  }
                                  if (0 < lVar4) {
                                    return -3;
                                  }
                                  if ((-1 < local_c0) &&
                                     (local_c0 < *len_local + (long)pReader->_vptr_IMkvReader)) {
                                    return -2;
                                  }
                                  if (lStack_40 < *len_local + (long)pReader->_vptr_IMkvReader) {
                                    return -3;
                                  }
                                  size_00 = (_func_int **)
                                            ReadUInt((IMkvReader *)total,*len_local,(long *)pReader)
                                  ;
                                  if ((long)size_00 < 0) {
                                    return (long)size_00;
                                  }
                                  if (size_00 ==
                                      (_func_int **)
                                      ((1L << ((char)pReader->_vptr_IMkvReader * '\a' & 0x3fU)) + -1
                                      )) {
                                    return -2;
                                  }
                                  *len_local = (long)pReader->_vptr_IMkvReader + *len_local;
                                  if ((-1 < local_c0) && (local_c0 < *len_local)) {
                                    return -2;
                                  }
                                } while (size_00 == (_func_int **)0x0);
                                if ((-1 < local_c0) && (local_c0 < (long)size_00 + *len_local)) {
                                  return -2;
                                }
                                if (lVar3 == 0xe7) {
                                  pReader->_vptr_IMkvReader = size_00;
                                  if (lStack_40 < (long)size_00 + *len_local) {
                                    return -3;
                                  }
                                  new_pos = UnserializeUInt((IMkvReader *)total,*len_local,
                                                            (longlong)size_00);
                                  if (new_pos < 0) {
                                    return new_pos;
                                  }
                                  lStack_80 = (long)size_00 + *len_local;
                                }
                                else {
                                  if (lVar3 == 0xa0) {
                                    bVar1 = true;
                                    goto LAB_00131504;
                                  }
                                  if (lVar3 == 0xa3) {
                                    bVar1 = true;
                                    goto LAB_00131504;
                                  }
                                }
                                *len_local = (long)size_00 + *len_local;
                              } while ((local_c0 < 0) || (*len_local <= local_c0));
                              this_local = (Cluster *)0xfffffffffffffffe;
                            }
                          }
                        }
                        else {
                          this_local = (Cluster *)0xfffffffffffffffd;
                        }
                      }
                    }
                  }
                  else {
                    this_local = (Cluster *)0xfffffffffffffffe;
                  }
                }
              }
            }
            else {
              this_local = (Cluster *)0xfffffffffffffffd;
            }
          }
        }
      }
      else {
        this_local = (Cluster *)0xfffffffffffffffe;
      }
    }
    else {
      this_local = (Cluster *)0xffffffffffffffff;
    }
  }
  else {
    this_local = (Cluster *)0x0;
  }
  return (long)this_local;
}

Assistant:

long Cluster::Load(long long& pos, long& len) const {
  if (m_pSegment == NULL)
    return E_PARSE_FAILED;

  if (m_timecode >= 0)  // at least partially loaded
    return 0;

  if (m_pos != m_element_start || m_element_size >= 0)
    return E_PARSE_FAILED;

  IMkvReader* const pReader = m_pSegment->m_pReader;
  long long total, avail;
  const int status = pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  if (total >= 0 && (avail > total || m_pos > total))
    return E_FILE_FORMAT_INVALID;

  pos = m_pos;

  long long cluster_size = -1;

  if ((pos + 1) > avail) {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  long long result = GetUIntLength(pReader, pos, len);

  if (result < 0)  // error or underflow
    return static_cast<long>(result);

  if (result > 0)
    return E_BUFFER_NOT_FULL;

  if ((pos + len) > avail)
    return E_BUFFER_NOT_FULL;

  const long long id_ = ReadID(pReader, pos, len);

  if (id_ < 0)  // error
    return static_cast<long>(id_);

  if (id_ != libwebm::kMkvCluster)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume id

  // read cluster size

  if ((pos + 1) > avail) {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  result = GetUIntLength(pReader, pos, len);

  if (result < 0)  // error
    return static_cast<long>(result);

  if (result > 0)
    return E_BUFFER_NOT_FULL;

  if ((pos + len) > avail)
    return E_BUFFER_NOT_FULL;

  const long long size = ReadUInt(pReader, pos, len);

  if (size < 0)  // error
    return static_cast<long>(cluster_size);

  if (size == 0)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume length of size of element

  const long long unknown_size = (1LL << (7 * len)) - 1;

  if (size != unknown_size)
    cluster_size = size;

  // pos points to start of payload
  long long timecode = -1;
  long long new_pos = -1;
  bool bBlock = false;

  long long cluster_stop = (cluster_size < 0) ? -1 : pos + cluster_size;

  for (;;) {
    if ((cluster_stop >= 0) && (pos >= cluster_stop))
      break;

    // Parse ID

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadID(pReader, pos, len);

    if (id < 0)  // error
      return static_cast<long>(id);

    if (id == 0)
      return E_FILE_FORMAT_INVALID;

    // This is the distinguished set of ID's we use to determine
    // that we have exhausted the sub-element's inside the cluster
    // whose ID we parsed earlier.

    if (id == libwebm::kMkvCluster)
      break;

    if (id == libwebm::kMkvCues)
      break;

    pos += len;  // consume ID field

    // Parse Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume size field

    if ((cluster_stop >= 0) && (pos > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    // pos now points to start of payload

    if (size == 0)
      continue;

    if ((cluster_stop >= 0) && ((pos + size) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if (id == libwebm::kMkvTimecode) {
      len = static_cast<long>(size);

      if ((pos + size) > avail)
        return E_BUFFER_NOT_FULL;

      timecode = UnserializeUInt(pReader, pos, size);

      if (timecode < 0)  // error (or underflow)
        return static_cast<long>(timecode);

      new_pos = pos + size;

      if (bBlock)
        break;
    } else if (id == libwebm::kMkvBlockGroup) {
      bBlock = true;
      break;
    } else if (id == libwebm::kMkvSimpleBlock) {
      bBlock = true;
      break;
    }

    pos += size;  // consume payload
    if (cluster_stop >= 0 && pos > cluster_stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (cluster_stop >= 0 && pos > cluster_stop)
    return E_FILE_FORMAT_INVALID;

  if (timecode < 0)  // no timecode found
    return E_FILE_FORMAT_INVALID;

  if (!bBlock)
    return E_FILE_FORMAT_INVALID;

  m_pos = new_pos;  // designates position just beyond timecode payload
  m_timecode = timecode;  // m_timecode >= 0 means we're partially loaded

  if (cluster_size >= 0)
    m_element_size = cluster_stop - m_element_start;

  return 0;
}